

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult *
iutest::internal::CmpHelperFloatingPointComplexEQ<float>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,complex<float> *val1,
          complex<float> *val2)

{
  bool bVar1;
  complex<float> *pcVar2;
  floating_point<float> imag2;
  floating_point<float> imag1;
  floating_point<float> real2;
  floating_point<float> real1;
  FInt local_c0;
  FInt local_bc;
  FInt local_b8;
  FInt local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b4 = *(FInt *)&val1->_M_value;
  local_b8 = *(FInt *)&val2->_M_value;
  local_bc = *(FInt *)((long)&val1->_M_value + 4);
  local_c0 = *(FInt *)((long)&val2->_M_value + 4);
  pcVar2 = val1;
  bVar1 = floating_point<float>::AlmostEquals((floating_point<float> *)&local_b4,(_Myt *)&local_b8);
  if ((bVar1) &&
     (bVar1 = floating_point<float>::AlmostEquals
                        ((floating_point<float> *)&local_bc,(_Myt *)&local_c0), bVar1)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
    return __return_storage_ptr__;
  }
  FormatForComparisonFailureMessage<std::complex<float>,std::complex<float>>
            (&local_50,(internal *)val1,val2,pcVar2);
  detail::ShowStringQuoted(&local_70,&local_50);
  FormatForComparisonFailureMessage<std::complex<float>,std::complex<float>>
            (&local_b0,(internal *)val2,val1,pcVar2);
  detail::ShowStringQuoted(&local_90,&local_b0);
  EqFailure(__return_storage_ptr__,expr1,expr2,&local_70,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointComplexEQ(const char* expr1, const char* expr2
                                                , const ::std::complex<RawType>& val1, const ::std::complex<RawType>& val2)
{
    floating_point<RawType> real1(val1.real()), real2(val2.real());
    floating_point<RawType> imag1(val1.imag()), imag2(val2.imag());
    if IUTEST_COND_LIKELY( real1.AlmostEquals(real2) && imag1.AlmostEquals(imag2) )
    {
        return AssertionSuccess();
    }